

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

void __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,ExprPrinter>::
DoReadArgs<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,ExprPrinter>::NumericExprReader,mp::NLHandler<mp::NullNLHandler<std::__cxx11::string>,std::__cxx11::string>::ArgHandler>
          (NLReader<mp::internal::TextReader<fmt::Locale>,ExprPrinter> *this,int num_args,
          ArgHandler *arg_handler)

{
  long *plVar1;
  char *pcVar2;
  NumericExpr local_40;
  
  if (0 < num_args) {
    do {
      plVar1 = *(long **)this;
      pcVar2 = (char *)*plVar1;
      plVar1[3] = (long)pcVar2;
      *plVar1 = (long)(pcVar2 + 1);
      ReadNumericExpr_abi_cxx11_(&local_40,this,*pcVar2,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      num_args = num_args + -1;
    } while (num_args != 0);
  }
  return;
}

Assistant:

void DoReadArgs(int num_args, ArgHandler &arg_handler) {
    ExprReader expr_reader;
    for (int i = 0; i < num_args; ++i)
      arg_handler.AddArg(expr_reader.Read(*this));
  }